

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChAssembly.cpp
# Opt level: O3

void __thiscall
chrono::ChAssembly::KRMmatricesLoad(ChAssembly *this,double Kfactor,double Rfactor,double Mfactor)

{
  pointer psVar1;
  pointer psVar2;
  pointer psVar3;
  pointer psVar4;
  pointer psVar5;
  shared_ptr<chrono::ChBody> *body;
  pointer psVar6;
  pointer psVar7;
  pointer psVar8;
  pointer psVar9;
  pointer psVar10;
  
  psVar1 = (this->bodylist).
           super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar6 = (this->bodylist).
                super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar6 != psVar1; psVar6 = psVar6 + 1) {
    (*(((psVar6->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
      super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x3a])(Kfactor,Rfactor,Mfactor);
  }
  psVar2 = (this->shaftlist).
           super__Vector_base<std::shared_ptr<chrono::ChShaft>,_std::allocator<std::shared_ptr<chrono::ChShaft>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar7 = (this->shaftlist).
                super__Vector_base<std::shared_ptr<chrono::ChShaft>,_std::allocator<std::shared_ptr<chrono::ChShaft>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar7 != psVar2; psVar7 = psVar7 + 1) {
    (*(((psVar7->super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
      super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x3a])(Kfactor,Rfactor,Mfactor);
  }
  psVar3 = (this->linklist).
           super__Vector_base<std::shared_ptr<chrono::ChLinkBase>,_std::allocator<std::shared_ptr<chrono::ChLinkBase>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar8 = (this->linklist).
                super__Vector_base<std::shared_ptr<chrono::ChLinkBase>,_std::allocator<std::shared_ptr<chrono::ChLinkBase>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar8 != psVar3; psVar8 = psVar8 + 1) {
    (*(((psVar8->super___shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
      super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x3a])(Kfactor,Rfactor,Mfactor);
  }
  psVar4 = (this->meshlist).
           super__Vector_base<std::shared_ptr<chrono::fea::ChMesh>,_std::allocator<std::shared_ptr<chrono::fea::ChMesh>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar9 = (this->meshlist).
                super__Vector_base<std::shared_ptr<chrono::fea::ChMesh>,_std::allocator<std::shared_ptr<chrono::fea::ChMesh>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar9 != psVar4; psVar9 = psVar9 + 1) {
    (*(((psVar9->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
      super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3a])
              (Kfactor,Rfactor,Mfactor);
  }
  psVar5 = (this->otherphysicslist).
           super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar10 = (this->otherphysicslist).
                 super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar10 != psVar5; psVar10 = psVar10 + 1
      ) {
    (*(((psVar10->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
      super_ChObj)._vptr_ChObj[0x3a])(Kfactor,Rfactor,Mfactor);
  }
  return;
}

Assistant:

void ChAssembly::KRMmatricesLoad(double Kfactor, double Rfactor, double Mfactor) {
    for (auto& body : bodylist) {
        body->KRMmatricesLoad(Kfactor, Rfactor, Mfactor);
    }
    for (auto& shaft : shaftlist) {
        shaft->KRMmatricesLoad(Kfactor, Rfactor, Mfactor);
    }
    for (auto& link : linklist) {
        link->KRMmatricesLoad(Kfactor, Rfactor, Mfactor);
    }
    for (auto& mesh : meshlist) {
        mesh->KRMmatricesLoad(Kfactor, Rfactor, Mfactor);
    }
    for (auto& item : otherphysicslist) {
        item->KRMmatricesLoad(Kfactor, Rfactor, Mfactor);
    }
}